

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcGetFunction(char *name,NULLCFuncPtr *func)

{
  uint uVar1;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if (func == (NULLCFuncPtr *)0x0) {
    NULLC::nullcLastError = "ERROR: passed pointer to NULLC function is \'null\'";
  }
  else {
    uVar1 = nullcFindFunctionIndex(name);
    if (uVar1 != 0xffffffff) {
      func->id = uVar1;
      func->context = (void *)0x0;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

nullres nullcGetFunction(const char* name, NULLCFuncPtr* func)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	if(!func)
	{
		nullcLastError = "ERROR: passed pointer to NULLC function is 'null'";
		return false;
	}
	unsigned index = nullcFindFunctionIndex(name);
	if(index == ~0u)
		return false;
	func->id = index;
	func->context = NULL;
	return true;
}